

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O0

Sphere * __thiscall SceneParser::parseSphere(SceneParser *this)

{
  int iVar1;
  Sphere *this_00;
  float radius_00;
  undefined1 local_84 [4];
  float radius;
  Vector3f center;
  char token [100];
  SceneParser *this_local;
  
  getToken(this,(char *)(center.m_elements + 1));
  iVar1 = strcmp((char *)(center.m_elements + 1),"{");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x144,"Sphere *SceneParser::parseSphere()");
  }
  getToken(this,(char *)(center.m_elements + 1));
  iVar1 = strcmp((char *)(center.m_elements + 1),"center");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"center\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x146,"Sphere *SceneParser::parseSphere()");
  }
  readVector3f((SceneParser *)local_84);
  getToken(this,(char *)(center.m_elements + 1));
  iVar1 = strcmp((char *)(center.m_elements + 1),"radius");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"radius\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x149,"Sphere *SceneParser::parseSphere()");
  }
  radius_00 = readFloat(this);
  getToken(this,(char *)(center.m_elements + 1));
  iVar1 = strcmp((char *)(center.m_elements + 1),"}");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"}\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x14c,"Sphere *SceneParser::parseSphere()");
  }
  if (this->_current_material != (Material *)0x0) {
    this_00 = (Sphere *)operator_new(0x40);
    Sphere::Sphere(this_00,(Vector3f *)local_84,radius_00,this->_current_material);
    return this_00;
  }
  __assert_fail("_current_material != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x14d,"Sphere *SceneParser::parseSphere()");
}

Assistant:

Sphere *
SceneParser::parseSphere() {
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));
    getToken(token);
    assert(!strcmp(token, "center"));
    Vector3f center = readVector3f();
    getToken(token);
    assert(!strcmp(token, "radius"));
    float radius = readFloat();
    getToken(token);
    assert(!strcmp(token, "}"));
    assert(_current_material != NULL);
    return new Sphere(center, radius, _current_material);
}